

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

void __thiscall ncnn::Mat::to_pixels(Mat *this,uchar *pixels,int type)

{
  uint in_EDX;
  Mat *in_RSI;
  undefined8 in_RDI;
  int type_to;
  undefined4 local_24;
  int stride;
  int type_00;
  
  if ((in_EDX & 0xffff0000) == 0) {
    local_24 = in_EDX & 0xffff;
  }
  else {
    local_24 = (int)in_EDX >> 0x10;
  }
  type_00 = (int)((ulong)in_RDI >> 0x20);
  stride = (int)in_RDI;
  if ((local_24 == 1) || (local_24 == 2)) {
    to_pixels(in_RSI,(uchar *)CONCAT44(in_EDX,local_24),type_00,stride);
  }
  else if (local_24 == 3) {
    to_pixels(in_RSI,(uchar *)CONCAT44(in_EDX,3),type_00,stride);
  }
  else if (local_24 == 4) {
    to_pixels(in_RSI,(uchar *)CONCAT44(in_EDX,4),type_00,stride);
  }
  return;
}

Assistant:

void Mat::to_pixels(unsigned char* pixels, int type) const
{
    int type_to = (type & PIXEL_CONVERT_MASK) ? (type >> PIXEL_CONVERT_SHIFT) : (type & PIXEL_FORMAT_MASK);

    if (type_to == PIXEL_RGB || type_to == PIXEL_BGR)
    {
        to_pixels(pixels, type, w * 3);
    }
    else if (type_to == PIXEL_GRAY)
    {
        to_pixels(pixels, type, w * 1);
    }
    else if (type_to == PIXEL_RGBA)
    {
        to_pixels(pixels, type, w * 4);
    }
}